

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

FieldDescriptor * google::protobuf::compiler::java::MapValueField(FieldDescriptor *descriptor)

{
  Descriptor *this;
  FieldDescriptor *pFVar1;
  java local_10 [16];
  
  if (descriptor->type_ == '\v') {
    this = FieldDescriptor::message_type(descriptor);
    if ((this->options_->field_0)._impl_.map_entry_ != false) {
      pFVar1 = Descriptor::map_value(this);
      return pFVar1;
    }
  }
  else {
    MapValueField();
  }
  MapValueField(local_10);
}

Assistant:

const FieldDescriptor* MapValueField(const FieldDescriptor* descriptor) {
  ABSL_CHECK_EQ(FieldDescriptor::TYPE_MESSAGE, descriptor->type());
  const Descriptor* message = descriptor->message_type();
  ABSL_CHECK(message->options().map_entry());
  return message->map_value();
}